

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O2

void __thiscall xercesc_4_0::QName::QName(QName *this,QName *qname)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__QName_003f9648;
  this->fPrefixBufSz = 0;
  this->fLocalPartBufSz = 0;
  *(undefined8 *)((long)&this->fLocalPartBufSz + 4) = 0;
  *(undefined8 *)((long)&this->fRawNameBufSz + 4) = 0;
  this->fRawName = (XMLCh *)0x0;
  this->fPrefix = (XMLCh *)0x0;
  this->fLocalPart = (XMLCh *)0x0;
  this->fMemoryManager = qname->fMemoryManager;
  XVar2 = XMLString::stringLen(qname->fLocalPart);
  this->fLocalPartBufSz = XVar2 + 8;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar2 * 2 + 0x12);
  this->fLocalPart = (XMLCh *)CONCAT44(extraout_var,iVar1);
  memmove((XMLCh *)CONCAT44(extraout_var,iVar1),qname->fLocalPart,XVar2 * 2 + 2);
  XVar2 = XMLString::stringLen(qname->fPrefix);
  this->fPrefixBufSz = XVar2 + 8;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,XVar2 * 2 + 0x12);
  this->fPrefix = (XMLCh *)CONCAT44(extraout_var_00,iVar1);
  memmove((XMLCh *)CONCAT44(extraout_var_00,iVar1),qname->fPrefix,XVar2 * 2 + 2);
  this->fURIId = qname->fURIId;
  return;
}

Assistant:

QName::QName(const QName& qname)
:XSerializable(qname)
,XMemory(qname)
,fPrefixBufSz(0)
,fLocalPartBufSz(0)
,fRawNameBufSz(0)
,fURIId(0)
,fPrefix(0)
,fLocalPart(0)
,fRawName(0)
,fMemoryManager(qname.fMemoryManager)
{
    XMLSize_t newLen;

    newLen = XMLString::stringLen(qname.getLocalPart());
    fLocalPartBufSz = newLen + 8;
    fLocalPart = (XMLCh*) fMemoryManager->allocate
    (
        (fLocalPartBufSz + 1) * sizeof(XMLCh)
    ); //new XMLCh[fLocalPartBufSz + 1];
    XMLString::moveChars(fLocalPart, qname.getLocalPart(), newLen + 1);

    newLen = XMLString::stringLen(qname.getPrefix());
    fPrefixBufSz = newLen + 8;
    fPrefix = (XMLCh*) fMemoryManager->allocate
    (
        (fPrefixBufSz + 1) * sizeof(XMLCh)
    ); //new XMLCh[fPrefixBufSz + 1];
    XMLString::moveChars(fPrefix, qname.getPrefix(), newLen + 1);

    fURIId = qname.getURI();
}